

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

int Saig_StrSimDetectUnique(Aig_Man_t *p0,Aig_Man_t *p1)

{
  uint uVar1;
  Aig_Obj_t **ppTable;
  Aig_Obj_t **ppNexts;
  void *__ptr;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  Aig_Obj_t *pAVar7;
  uint uVar8;
  uint nTableSize;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  iVar9 = p0->vObjs->nSize;
  nTableSize = (iVar9 - p0->nDeleted) / 2 - 1;
  while( true ) {
    do {
      uVar8 = nTableSize;
      nTableSize = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (nTableSize < 9) break;
    iVar4 = 5;
    while (nTableSize % (iVar4 - 2U) != 0) {
      uVar1 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (nTableSize < uVar1) goto LAB_006ec23b;
    }
  }
LAB_006ec23b:
  ppTable = (Aig_Obj_t **)calloc((long)(int)nTableSize,8);
  ppNexts = (Aig_Obj_t **)calloc((long)iVar9,8);
  __ptr = calloc((long)iVar9,8);
  pVVar3 = p0->vObjs;
  if (0 < pVVar3->nSize) {
    lVar10 = 0;
    do {
      pAVar7 = (Aig_Obj_t *)pVVar3->pArray[lVar10];
      if (((pAVar7 != (Aig_Obj_t *)0x0) &&
          ((uVar1 = (uint)*(undefined8 *)&pAVar7->field_0x18, (uVar1 & 7) == 2 ||
           (0xfffffffd < (uVar1 & 7) - 7)))) &&
         ((p0->pReprs == (Aig_Obj_t **)0x0 || (p0->pReprs[pAVar7->Id] == (Aig_Obj_t *)0x0)))) {
        lVar5 = 0;
        do {
          iVar9 = *(int *)((long)(pAVar7->field_5).pData + lVar5 * 4);
          if (iVar9 != 0) break;
          bVar11 = lVar5 != 0xf;
          lVar5 = lVar5 + 1;
        } while (bVar11);
        if (iVar9 != 0) {
          lVar5 = 0;
          do {
            iVar9 = *(int *)((long)(pAVar7->field_5).pData + lVar5 * 4);
            if (iVar9 != -1) break;
            bVar11 = lVar5 != 0xf;
            lVar5 = lVar5 + 1;
          } while (bVar11);
          if (iVar9 != -1) {
            pAVar2 = Saig_StrSimTableLookup(ppTable,ppNexts,nTableSize,pAVar7);
            if (pAVar2 == (Aig_Obj_t *)0x0) {
              Saig_StrSimTableInsert(ppTable,ppNexts,nTableSize,pAVar7);
            }
            else {
              pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar3 = p0->vObjs;
    } while (lVar10 < pVVar3->nSize);
  }
  pVVar3 = p1->vObjs;
  if (0 < pVVar3->nSize) {
    lVar10 = 0;
    do {
      pAVar7 = (Aig_Obj_t *)pVVar3->pArray[lVar10];
      if (((pAVar7 != (Aig_Obj_t *)0x0) &&
          ((uVar1 = (uint)*(undefined8 *)&pAVar7->field_0x18, (uVar1 & 7) == 2 ||
           (0xfffffffd < (uVar1 & 7) - 7)))) &&
         ((p1->pReprs == (Aig_Obj_t **)0x0 || (p1->pReprs[pAVar7->Id] == (Aig_Obj_t *)0x0)))) {
        lVar5 = 0;
        do {
          iVar9 = *(int *)((long)(pAVar7->field_5).pData + lVar5 * 4);
          if (iVar9 != 0) break;
          bVar11 = lVar5 != 0xf;
          lVar5 = lVar5 + 1;
        } while (bVar11);
        if (iVar9 != 0) {
          lVar5 = 0;
          do {
            iVar9 = *(int *)((long)(pAVar7->field_5).pData + lVar5 * 4);
            if (iVar9 != -1) break;
            bVar11 = lVar5 != 0xf;
            lVar5 = lVar5 + 1;
          } while (bVar11);
          if ((iVar9 != -1) &&
             (pAVar2 = Saig_StrSimTableLookup(ppTable,ppNexts,nTableSize,pAVar7),
             pAVar2 != (Aig_Obj_t *)0x0)) {
            if (*(long *)((long)__ptr + (long)pAVar2->Id * 8) == 0) {
              *(Aig_Obj_t **)((long)__ptr + (long)pAVar2->Id * 8) = pAVar7;
            }
            else {
              pAVar2->field_0x18 = pAVar2->field_0x18 | 0x10;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar3 = p1->vObjs;
    } while (lVar10 < pVVar3->nSize);
  }
  iVar9 = 0;
  if (uVar8 < 0x7fffffff) {
    uVar6 = 0;
    iVar9 = 0;
    do {
      for (pAVar7 = ppTable[uVar6]; pAVar7 != (Aig_Obj_t *)0x0; pAVar7 = ppNexts[pAVar7->Id]) {
        if ((*(ulong *)&pAVar7->field_0x18 & 0x10) == 0) {
          pAVar2 = *(Aig_Obj_t **)((long)__ptr + (long)pAVar7->Id * 8);
          if ((pAVar2 != (Aig_Obj_t *)0x0) &&
             ((((uint)*(ulong *)&pAVar7->field_0x18 ^ *(uint *)&pAVar2->field_0x18) & 7) == 0)) {
            if (p0->pReprs == (Aig_Obj_t **)0x0) {
LAB_006ec4e2:
              __assert_fail("p->pReprs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
            }
            p0->pReprs[pAVar7->Id] = pAVar2;
            if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_006ec4e2;
            p1->pReprs[pAVar2->Id] = pAVar7;
            iVar9 = iVar9 + 1;
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != nTableSize);
  }
  Aig_ManCleanMarkA(p0);
  if (ppTable != (Aig_Obj_t **)0x0) {
    free(ppTable);
  }
  if (ppNexts != (Aig_Obj_t **)0x0) {
    free(ppNexts);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar9;
}

Assistant:

int Saig_StrSimDetectUnique( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppCands;
    Aig_Obj_t * pObj, * pEntry;
    int i, nTableSize, Counter;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNum(p0)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );
    ppCands = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p0) );

    // hash nodes of the first AIG
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p0, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // insert
            Saig_StrSimTableInsert( ppTable, ppNexts, nTableSize, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // hash nodes from the second AIG
    Aig_ManForEachObj( p1, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( Aig_ObjRepr(p1, pObj) )
            continue;
        if ( Saig_StrSimIsZero(pObj) || Saig_StrSimIsOne(pObj) )
            continue;
        // check if the entry exists
        pEntry = Saig_StrSimTableLookup( ppTable, ppNexts, nTableSize, pObj );
        if ( pEntry == NULL ) // skip
            continue;
        // if there is no candidate, label it
        if ( Saig_ObjNext( ppCands, pEntry ) == NULL )
            Saig_ObjSetNext( ppCands, pEntry, pObj );
        else // mark the entry as not unique
            pEntry->fMarkA = 1;
    }

    // create representatives for the unique entries
    Counter = 0;
    for ( i = 0; i < nTableSize; i++ )
        for ( pEntry = ppTable[i]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
            if ( !pEntry->fMarkA && (pObj = Saig_ObjNext( ppCands, pEntry )) )
            {
//                assert( Aig_ObjIsNode(pEntry) == Aig_ObjIsNode(pObj) );
                if ( Aig_ObjType(pEntry) != Aig_ObjType(pObj) )
                    continue;
                Aig_ObjSetRepr( p0, pEntry, pObj );
                Aig_ObjSetRepr( p1, pObj, pEntry );
                Counter++;
            }

    // cleanup
    Aig_ManCleanMarkA( p0 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    ABC_FREE( ppCands );
    return Counter;
}